

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbmphandler.cpp
# Opt level: O3

bool read_dib_body(QDataStream *s,BMP_INFOHDR *bi,qint64 datapos,qint64 startpos,QImage *image)

{
  uint *puVar1;
  ushort uVar2;
  Representation RVar3;
  Representation RVar4;
  uint3 uVar5;
  char cVar6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  quint32 qVar10;
  QRgb QVar11;
  QRgb QVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  qsizetype qVar16;
  uchar *__s;
  long lVar17;
  ushort *puVar18;
  byte *pbVar19;
  ulong uVar20;
  void *__dest;
  byte *pbVar21;
  int colorCount;
  uint *puVar22;
  long lVar23;
  int i;
  uint uVar24;
  uint uVar25;
  int iVar26;
  byte *pbVar27;
  byte *pbVar28;
  Format format;
  QSize size;
  ushort *puVar29;
  byte bVar30;
  bool bVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  uchar *puVar36;
  uint uVar37;
  uchar *__s_00;
  ulong uVar38;
  ulong uVar39;
  long in_FS_OFFSET;
  uint result_2;
  uint result;
  uint result_1;
  uint result_3;
  char tmp;
  uint alpha_mask;
  uint blue_mask;
  uint green_mask;
  uint red_mask;
  quint8 b;
  uint local_f8;
  byte local_f4;
  byte local_f0;
  byte local_e8;
  ulong local_d0;
  int local_c8;
  quint32 local_4c;
  quint32 local_48;
  quint32 local_44;
  quint32 local_40;
  uint local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  cVar6 = (**(code **)(*(long *)s + 0x90))();
  bVar7 = false;
  if (cVar6 != '\0') goto LAB_0026cb15;
  iVar26 = bi->biSize;
  RVar3.m_i = bi->biWidth;
  uVar25 = bi->biHeight;
  uVar2 = bi->biBitCount;
  iVar8 = bi->biCompression;
  local_40 = 0;
  local_44 = 0;
  local_48 = 0;
  local_4c = 0;
  cVar6 = (**(code **)(*(long *)s + 0x60))(s);
  if (cVar6 == '\0') {
    (**(code **)(*(long *)s + 0x88))(s,bi->biSize + startpos);
  }
  uVar37 = iVar8 - 5;
  if (bi->biSize < 0x6c) {
    qVar10 = 0;
    if (uVar37 < 0xfffffffe) goto LAB_0026bb85;
    bVar30 = 1;
    if ((uVar2 != 0x20) && (uVar2 != 0x10)) goto LAB_0026bc51;
    lVar14 = QIODevice::read((char *)s,(longlong)&local_40);
    if ((lVar14 == 4) &&
       ((lVar14 = QIODevice::read((char *)s,(longlong)&local_44), lVar14 == 4 &&
        (lVar14 = QIODevice::read((char *)s,(longlong)&local_48), lVar14 == 4)))) {
      if (iVar8 == 4) {
        lVar14 = QIODevice::read((char *)s,(longlong)&local_4c);
        bVar30 = 1;
        if (lVar14 != 4) goto LAB_0026cb12;
      }
      else {
        bVar30 = 1;
      }
      goto LAB_0026bc51;
    }
  }
  else {
    local_40 = bi->biRedMask;
    local_44 = bi->biGreenMask;
    local_48 = bi->biBlueMask;
    qVar10 = bi->biAlphaMask;
    bVar30 = 1;
    local_4c = qVar10;
    if (0xfffffffd < uVar37) goto LAB_0026bc51;
LAB_0026bb85:
    if (uVar2 == 0x20 && iVar8 == 0) {
      bVar31 = qVar10 == 0xff000000;
LAB_0026bcbf:
      format = bVar31 | Format_RGB32;
      colorCount = 0;
    }
    else {
      bVar30 = 0;
LAB_0026bc51:
      bVar7 = false;
      if (0x20 < uVar2) goto LAB_0026cb15;
      bVar31 = (bool)(bVar30 & local_4c != 0);
      uVar15 = (ulong)(uint)uVar2;
      if ((0x101010000U >> (uVar15 & 0x3f) & 1) != 0) goto LAB_0026bcbf;
      format = Format_Indexed8;
      if ((0x110UL >> (uVar15 & 0x3f) & 1) == 0) {
        if (uVar15 != 1) goto LAB_0026cb15;
        format = Format_Mono;
      }
      colorCount = 1 << ((byte)uVar2 & 0x1f);
      if (bi->biClrUsed != 0) {
        colorCount = bi->biClrUsed;
      }
      if (colorCount - 0x101U < 0xffffff00) goto LAB_0026cb12;
    }
    RVar4.m_i = -uVar25;
    if (-1 < bi->biHeight) {
      RVar4.m_i = uVar25;
    }
    size.ht.m_i = RVar4.m_i;
    size.wd.m_i = RVar3.m_i;
    bVar7 = QImageIOHandler::allocateImage(size,format,image);
    if (bVar7) {
      if (colorCount == 0) {
        if (0xfffffffd < uVar37) {
          if (uVar2 != 0x20) {
            uVar13 = 0;
            uVar37 = 0;
            uVar25 = 0;
            uVar24 = 0;
            local_f4 = 0;
            local_e8 = 0;
            local_f8._0_1_ = 0;
            local_f0 = 0;
            if (uVar2 != 0x10) goto LAB_0026bdd5;
          }
          local_f0 = 0;
          for (qVar10 = local_40; (0xff < qVar10 || ((qVar10 != 0 && ((qVar10 & 1) == 0))));
              qVar10 = qVar10 >> 1) {
            local_f0 = local_f0 + 1;
          }
          uVar25 = local_40 >> (local_f0 & 0x1f);
          if (uVar25 != 0xffffffff) {
            uVar24 = 8;
            if (local_40 >> (local_f0 & 0x1f) != 0) {
              uVar37 = 8;
              do {
                uVar24 = uVar37 - 1;
                if (uVar25 < 2) break;
                uVar25 = uVar25 >> 1;
                bVar7 = uVar37 != 1;
                uVar37 = uVar24;
              } while (bVar7);
            }
            local_f8._0_1_ = 0;
            for (qVar10 = local_44; (0xff < qVar10 || ((qVar10 != 0 && ((qVar10 & 1) == 0))));
                qVar10 = qVar10 >> 1) {
              local_f8._0_1_ = (byte)local_f8 + 1;
            }
            uVar37 = local_44 >> ((byte)local_f8 & 0x1f);
            if (uVar37 != 0xffffffff) {
              uVar25 = 8;
              if (local_44 >> ((byte)local_f8 & 0x1f) != 0) {
                uVar13 = 8;
                do {
                  uVar25 = uVar13 - 1;
                  if (uVar37 < 2) break;
                  uVar37 = uVar37 >> 1;
                  bVar7 = uVar13 != 1;
                  uVar13 = uVar25;
                } while (bVar7);
              }
              local_e8 = 0;
              for (qVar10 = local_48; (0xff < qVar10 || ((qVar10 != 0 && ((qVar10 & 1) == 0))));
                  qVar10 = qVar10 >> 1) {
                local_e8 = local_e8 + 1;
              }
              uVar13 = local_48 >> (local_e8 & 0x1f);
              if (uVar13 != 0xffffffff) {
                uVar37 = 8;
                if (local_48 >> (local_e8 & 0x1f) != 0) {
                  uVar9 = 8;
                  do {
                    uVar37 = uVar9 - 1;
                    if (uVar13 < 2) break;
                    uVar13 = uVar13 >> 1;
                    bVar7 = uVar9 != 1;
                    uVar9 = uVar37;
                  } while (bVar7);
                }
                local_f4 = 0;
                for (qVar10 = local_4c; (0xff < qVar10 || ((qVar10 != 0 && ((qVar10 & 1) == 0))));
                    qVar10 = qVar10 >> 1) {
                  local_f4 = local_f4 + 1;
                }
                uVar9 = local_4c >> (local_f4 & 0x1f);
                if (uVar9 != 0xffffffff) {
                  if (local_4c >> (local_f4 & 0x1f) == 0) {
                    uVar13 = 8;
                  }
                  else {
                    uVar32 = 8;
                    do {
                      uVar13 = uVar32 - 1;
                      if (uVar9 < 2) break;
                      uVar9 = uVar9 >> 1;
                      bVar7 = uVar32 != 1;
                      uVar32 = uVar13;
                    } while (bVar7);
                  }
                  goto LAB_0026bdd5;
                }
              }
            }
          }
          goto LAB_0026cb12;
        }
        uVar13 = 0;
        if (iVar8 != 0) goto LAB_0026bdaf;
        if (uVar2 == 0x10) {
          local_48 = 0x1f;
          local_44 = 0x3e0;
          local_40 = 0x7c00;
          local_f0 = 10;
          local_f8._0_1_ = 5;
          uVar37 = 3;
          uVar25 = 3;
          uVar24 = 3;
LAB_0026cb81:
          local_f4 = 0;
        }
        else {
          if ((uVar2 != 0x20) && (uVar2 != 0x18)) goto LAB_0026bdaf;
          local_48 = 0xff;
          local_44 = 0xff00;
          local_40 = 0xff0000;
          local_f0 = 0x10;
          local_f8._0_1_ = 8;
          if (bVar31 == false) {
            uVar37 = 0;
            uVar25 = 0;
            uVar24 = 0;
            local_f0 = 0x10;
            goto LAB_0026cb81;
          }
          local_f4 = 0;
          for (qVar10 = local_4c; (0xff < qVar10 || ((qVar10 != 0 && ((qVar10 & 1) == 0))));
              qVar10 = qVar10 >> 1) {
            local_f4 = local_f4 + 1;
          }
          uVar24 = local_4c >> (local_f4 & 0x1f);
          if (uVar24 == 0xffffffff) goto LAB_0026cb12;
          if (local_4c >> (local_f4 & 0x1f) == 0) {
            uVar13 = 8;
            local_e8 = (byte)uVar24;
            local_f8._0_1_ = 8;
            uVar25 = uVar24;
            uVar37 = uVar24;
            goto LAB_0026bdd5;
          }
          local_f8._0_1_ = 8;
          uVar25 = 0;
          uVar37 = 8;
          do {
            uVar13 = uVar37 - 1;
            if (uVar24 < 2) break;
            uVar24 = uVar24 >> 1;
            bVar7 = uVar37 != 1;
            uVar37 = uVar13;
          } while (bVar7);
          uVar37 = 0;
          uVar24 = 0;
          local_f0 = 0x10;
        }
        local_e8 = 0;
      }
      else {
        QImage::setColorCount(image,colorCount);
        local_3c = 0xaaaaaaaa;
        i = 0;
        do {
          lVar14 = QIODevice::read((char *)s,(longlong)&local_3c);
          if (lVar14 != (ulong)(iVar26 != 0xc) + 3) goto LAB_0026cb12;
          QImage::setColor(image,i,local_3c & 0xffffff | 0xff000000);
          cVar6 = (**(code **)(*(long *)s + 0x90))(s);
          if (cVar6 != '\0') goto LAB_0026cb12;
          i = i + 1;
        } while (colorCount != i);
LAB_0026bdaf:
        uVar13 = 0;
        uVar24 = 0;
        local_f4 = 0;
        local_e8 = 0;
        local_f8._0_1_ = 0;
        local_f0 = 0;
        uVar25 = 0;
        uVar37 = 0;
      }
LAB_0026bdd5:
      uVar15 = (ulong)RVar3.m_i;
      QImage::setDotsPerMeterX(image,bi->biXPelsPerMeter);
      QImage::setDotsPerMeterY(image,bi->biYPelsPerMeter);
      if (((-1 < datapos) && (lVar14 = (**(code **)(*(long *)s + 0x78))(s), lVar14 < datapos)) &&
         (cVar6 = (**(code **)(*(long *)s + 0x60))(s), cVar6 == '\0')) {
        (**(code **)(*(long *)s + 0x88))(s);
      }
      qVar16 = QImage::bytesPerLine(image);
      __s = QImage::bits(image);
      local_c8 = (int)qVar16;
      if (uVar2 < 0x10) {
        if (uVar2 == 1) {
          lVar23 = (long)local_c8;
          puVar36 = __s + ((long)RVar4.m_i + -1) * lVar23;
          lVar14 = (long)RVar4.m_i + 1;
          do {
            if (lVar14 + -1 == 0 || lVar14 < 1) break;
            lVar17 = QIODevice::read((char *)s,(longlong)puVar36);
            puVar36 = puVar36 + -lVar23;
            lVar14 = lVar14 + -1;
          } while (lVar17 == lVar23);
          if (colorCount == 2) {
            QVar11 = QImage::color(image,0);
            QVar12 = QImage::color(image,1);
            if ((QVar11 & 0xff) * 5 + (QVar11 >> 4 & 0xff0) + (QVar11 >> 0x10 & 0xff) * 0xb >> 5 <
                (QVar12 & 0xff) * 5 + (QVar12 >> 4 & 0xff0) + (QVar12 >> 0x10 & 0xff) * 0xb >> 5) {
              swapPixel01(image);
            }
          }
        }
        else if (uVar2 == 4) {
          iVar26 = RVar3.m_i + 0xe;
          if (-1 < (int)(RVar3.m_i + 7U)) {
            iVar26 = RVar3.m_i + 7U;
          }
          uVar39 = (ulong)((iVar26 >> 3) << 2);
          pbVar19 = (byte *)operator_new__(uVar39);
          if (iVar8 == 0) {
            memset(__s,0,(long)(RVar4.m_i * local_c8));
            if (0 < RVar4.m_i) {
              uVar38 = (ulong)(uint)RVar4.m_i;
              do {
                uVar20 = QIODevice::read((char *)s,(longlong)pbVar19);
                if (uVar20 != uVar39) break;
                pbVar21 = __s + (uVar38 - 1) * (long)local_c8;
                pbVar27 = pbVar19;
                iVar26 = (int)(((uint)(uVar15 >> 0x1f) & 1) + RVar3.m_i) >> 1;
                if (1 < RVar3.m_i) {
                  do {
                    *pbVar21 = *pbVar27 >> 4;
                    bVar30 = *pbVar27;
                    pbVar27 = pbVar27 + 1;
                    pbVar21[1] = bVar30 & 0xf;
                    pbVar21 = pbVar21 + 2;
                    iVar26 = iVar26 + -1;
                  } while (iVar26 != 0);
                }
                if ((RVar3.m_i & 1U) != 0) {
                  *pbVar21 = *pbVar27 >> 4;
                }
                bVar7 = 1 < (long)uVar38;
                uVar38 = uVar38 - 1;
              } while (bVar7);
            }
          }
          else if (iVar8 == 2) {
            local_3c = CONCAT31(local_3c._1_3_,0xaa);
            if (0 < RVar4.m_i) {
              pbVar27 = __s + (int)((RVar4.m_i - 1U) * local_c8);
              pbVar21 = pbVar27 + uVar15;
              uVar25 = 0;
              local_f8 = 0;
              do {
                cVar6 = QIODevice::getChar((char *)s);
                if (cVar6 == '\0') break;
                uVar15 = (ulong)(byte)local_3c;
                if (uVar15 == 0) {
                  cVar6 = QIODevice::getChar((char *)s);
                  if (cVar6 == '\0') break;
                  uVar37 = local_3c & 0xff;
                  if ((byte)local_3c == 1) break;
                  if ((local_3c & 0xff) == 2) {
                    QIODevice::getChar((char *)s);
                    local_f8 = local_f8 + 0xaa;
                    QIODevice::getChar((char *)s);
                    uVar25 = uVar25 + 0xaa;
                    if ((uint)RVar3.m_i <= local_f8) {
                      local_f8 = RVar3.m_i - 1;
                    }
                    if ((uint)RVar4.m_i <= uVar25) {
                      uVar25 = RVar4.m_i - 1U;
                    }
                    pbVar27 = __s + (long)(int)((~uVar25 + RVar4.m_i) * local_c8) +
                                    (long)(int)local_f8;
                  }
                  else if ((local_3c & 0xff) == 0) {
                    iVar26 = (RVar4.m_i - 2U) - uVar25;
                    uVar25 = uVar25 + 1;
                    pbVar27 = __s + iVar26 * local_c8;
                    local_f8 = 0;
                  }
                  else {
                    if (pbVar21 < pbVar27 + (byte)local_3c) {
                      uVar37 = (int)pbVar21 - (int)pbVar27;
                      local_3c = CONCAT31(local_3c._1_3_,(char)uVar37);
                    }
                    uVar13 = uVar37 & 0xff;
                    if (1 < (byte)uVar37) {
                      uVar24 = uVar13 >> 1;
                      pbVar28 = pbVar27;
                      do {
                        QIODevice::getChar((char *)s);
                        *pbVar28 = (byte)local_3c >> 4;
                        pbVar27 = pbVar28 + 2;
                        pbVar28[1] = (byte)local_3c & 0xf;
                        uVar24 = uVar24 - 1;
                        pbVar28 = pbVar27;
                      } while (uVar24 != 0);
                    }
                    if ((uVar37 & 1) != 0) {
                      QIODevice::getChar((char *)s);
                      *pbVar27 = 10;
                      pbVar27 = pbVar27 + 1;
                    }
                    if ((uVar13 + 1 & 2) != 0) {
                      QIODevice::getChar((char *)s);
                    }
                    local_f8 = local_f8 + uVar13;
                  }
                }
                else {
                  if (pbVar21 < pbVar27 + uVar15) {
                    uVar37 = (int)pbVar21 - (int)pbVar27;
                    uVar15 = (ulong)uVar37;
                    local_3c = CONCAT31(local_3c._1_3_,(char)uVar37);
                  }
                  QIODevice::getChar((char *)s);
                  if (1 < (byte)uVar15) {
                    uVar39 = (uVar15 & 0xff) >> 1;
                    pbVar28 = pbVar27;
                    do {
                      *pbVar28 = (byte)local_3c >> 4;
                      pbVar27 = pbVar28 + 2;
                      pbVar28[1] = (byte)local_3c & 0xf;
                      uVar37 = (int)uVar39 - 1;
                      uVar39 = (ulong)uVar37;
                      pbVar28 = pbVar27;
                    } while (uVar37 != 0);
                  }
                  if ((uVar15 & 1) != 0) {
                    *pbVar27 = (byte)local_3c >> 4;
                    pbVar27 = pbVar27 + 1;
                  }
                  local_f8 = local_f8 + (int)(uVar15 & 0xff);
                }
              } while ((int)uVar25 < RVar4.m_i);
            }
          }
          operator_delete__(pbVar19);
        }
        else if (uVar2 == 8) {
          if (iVar8 == 1) {
            local_3c = CONCAT31(local_3c._1_3_,0xaa);
            if (0 < RVar4.m_i) {
              __s_00 = __s + (int)((RVar4.m_i - 1U) * local_c8);
              puVar36 = __s_00 + uVar15;
              uVar37 = 0;
              uVar25 = 0;
              while (cVar6 = QIODevice::getChar((char *)s), cVar6 != '\0') {
                if ((ulong)(byte)local_3c == 0) {
                  cVar6 = QIODevice::getChar((char *)s);
                  if ((cVar6 == '\0') || ((byte)local_3c == 1)) break;
                  if ((ulong)(byte)local_3c == 2) {
                    QIODevice::getChar((char *)s);
                    uVar25 = uVar25 + 0xaa;
                    QIODevice::getChar((char *)s);
                    uVar37 = uVar37 + 0xaa;
                    if ((uint)RVar3.m_i <= uVar25) {
                      uVar25 = RVar3.m_i - 1;
                    }
                    if ((uint)RVar4.m_i <= uVar37) {
                      uVar37 = RVar4.m_i - 1U;
                    }
                    uVar15 = (ulong)(int)((~uVar37 + RVar4.m_i) * local_c8);
                    __s_00 = __s + (int)uVar25;
                    goto LAB_0026c865;
                  }
                  if ((byte)local_3c == 0) {
                    iVar26 = (RVar4.m_i - 2U) - uVar37;
                    uVar37 = uVar37 + 1;
                    __s_00 = __s + iVar26 * local_c8;
                    uVar25 = 0;
                  }
                  else {
                    if (puVar36 < __s_00 + (byte)local_3c) {
                      local_3c = CONCAT31(local_3c._1_3_,(char)puVar36 - (char)__s_00);
                    }
                    uVar15 = QIODevice::read((char *)s,(longlong)__s_00);
                    uVar39 = (ulong)(byte)local_3c;
                    if (uVar15 != uVar39) goto LAB_0026cb12;
                    if ((local_3c & 1) != 0) {
                      QIODevice::getChar((char *)s);
                      uVar39 = (ulong)(byte)local_3c;
                    }
                    uVar25 = uVar25 + (byte)local_3c;
                    __s_00 = __s_00 + uVar39;
                  }
                }
                else {
                  if (puVar36 < __s_00 + (byte)local_3c) {
                    local_3c = CONCAT31(local_3c._1_3_,(char)puVar36 - (char)__s_00);
                  }
                  QIODevice::getChar((char *)s);
                  memset(__s_00,0xaa,(ulong)(byte)local_3c);
                  uVar15 = (ulong)(byte)local_3c;
                  uVar25 = uVar25 + (local_3c & 0xff);
LAB_0026c865:
                  __s_00 = __s_00 + uVar15;
                }
                if (RVar4.m_i <= (int)uVar37) break;
              }
            }
          }
          else if (iVar8 == 0) {
            lVar23 = (long)local_c8;
            puVar36 = __s + ((long)RVar4.m_i + -1) * lVar23;
            lVar14 = (long)RVar4.m_i + 1;
            do {
              if (lVar14 + -1 == 0 || lVar14 < 1) break;
              lVar17 = QIODevice::read((char *)s,(longlong)puVar36);
              puVar36 = puVar36 + -lVar23;
              lVar14 = lVar14 + -1;
            } while (lVar17 == lVar23);
          }
        }
      }
      else if (((uVar2 == 0x10) || (uVar2 == 0x18)) || (uVar2 == 0x20)) {
        puVar18 = (ushort *)operator_new__((long)local_c8);
        if (0 < RVar4.m_i) {
          iVar8 = RVar3.m_i * (short)uVar2;
          iVar26 = iVar8 + 0x1f;
          iVar8 = iVar8 + 0x3e;
          if (-1 < iVar26) {
            iVar8 = iVar26;
          }
          local_d0 = (ulong)(uint)RVar4.m_i;
          do {
            lVar14 = QIODevice::read((char *)s,(longlong)puVar18);
            if (lVar14 != (iVar8 >> 5) << 2) break;
            if (0 < RVar3.m_i) {
              puVar22 = (uint *)(__s + (local_d0 - 1) * (long)local_c8);
              puVar1 = puVar22 + uVar15;
              puVar29 = puVar18;
              do {
                uVar9 = (uint)*puVar29;
                if (0x10 < uVar2) {
                  uVar5 = CONCAT12((char)puVar29[1],*puVar29);
                  uVar9 = (uint)uVar5;
                  if (0x18 < uVar2) {
                    uVar9 = CONCAT13(*(undefined1 *)((long)puVar29 + 3),uVar5);
                  }
                }
                uVar32 = (local_40 & uVar9) >> (local_f0 & 0x1f);
                if ((uVar24 & 7) != 0) {
                  uVar32 = uVar32 << ((byte)uVar24 & 0x1f);
                  uVar34 = 8 - uVar24;
                  do {
                    uVar32 = uVar32 | uVar32 >> ((byte)uVar34 & 0x1f);
                    uVar34 = uVar34 * 2;
                  } while (uVar34 < 8);
                }
                uVar34 = (local_44 & uVar9) >> ((byte)local_f8 & 0x1f);
                if ((uVar25 & 7) != 0) {
                  uVar34 = uVar34 << ((byte)uVar25 & 0x1f);
                  uVar35 = 8 - uVar25;
                  do {
                    uVar34 = uVar34 | uVar34 >> ((byte)uVar35 & 0x1f);
                    uVar35 = uVar35 * 2;
                  } while (uVar35 < 8);
                }
                uVar35 = (local_48 & uVar9) >> (local_e8 & 0x1f);
                if ((uVar37 & 7) != 0) {
                  uVar35 = uVar35 << ((byte)uVar37 & 0x1f);
                  uVar33 = 8 - uVar37;
                  do {
                    uVar35 = uVar35 | uVar35 >> ((byte)uVar33 & 0x1f);
                    uVar33 = uVar33 * 2;
                  } while (uVar33 < 8);
                }
                uVar33 = 0xff;
                if (bVar31 != false) {
                  uVar33 = (uVar9 & local_4c) >> (local_f4 & 0x1f);
                  if ((uVar13 & 7) != 0) {
                    uVar33 = uVar33 << ((byte)uVar13 & 0x1f);
                    uVar9 = 8 - uVar13;
                    do {
                      uVar33 = uVar33 | uVar33 >> ((byte)uVar9 & 0x1f);
                      uVar9 = uVar9 * 2;
                    } while (uVar9 < 8);
                  }
                }
                *puVar22 = uVar35 & 0xff |
                           (uVar34 & 0xff) << 8 | (uVar32 & 0xff) << 0x10 | uVar33 << 0x18;
                puVar22 = puVar22 + 1;
                puVar29 = (ushort *)((long)puVar29 + (ulong)((uint)(int)(short)uVar2 >> 3));
              } while (puVar22 < puVar1);
            }
            bVar7 = 1 < (long)local_d0;
            local_d0 = local_d0 - 1;
          } while (bVar7);
        }
        operator_delete__(puVar18);
      }
      uVar25 = bi->biHeight;
      bVar7 = true;
      if ((int)uVar25 < 0) {
        uVar15 = (ulong)local_c8;
        __dest = operator_new__(uVar15);
        if (uVar25 != 0xffffffff) {
          uVar39 = (ulong)(-uVar25 >> 1);
          iVar26 = ~uVar25 * local_c8;
          puVar36 = __s;
          do {
            memcpy(__dest,puVar36,uVar15);
            memcpy(puVar36,__s + iVar26,uVar15);
            memcpy(__s + iVar26,__dest,uVar15);
            iVar26 = iVar26 - local_c8;
            puVar36 = puVar36 + local_c8;
            uVar39 = uVar39 - 1;
          } while (uVar39 != 0);
        }
        operator_delete__(__dest);
        bVar7 = true;
      }
      goto LAB_0026cb15;
    }
  }
LAB_0026cb12:
  bVar7 = false;
LAB_0026cb15:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar7;
}

Assistant:

static bool read_dib_body(QDataStream &s, const BMP_INFOHDR &bi, qint64 datapos, qint64 startpos, QImage &image)
{
    QIODevice* d = s.device();
    if (d->atEnd())                                // end of stream/file
        return false;
#if 0
    qDebug("offset...........%lld", datapos);
    qDebug("startpos.........%lld", startpos);
    qDebug("biSize...........%d", bi.biSize);
    qDebug("biWidth..........%d", bi.biWidth);
    qDebug("biHeight.........%d", bi.biHeight);
    qDebug("biPlanes.........%d", bi.biPlanes);
    qDebug("biBitCount.......%d", bi.biBitCount);
    qDebug("biCompression....%d", bi.biCompression);
    qDebug("biSizeImage......%d", bi.biSizeImage);
    qDebug("biXPelsPerMeter..%d", bi.biXPelsPerMeter);
    qDebug("biYPelsPerMeter..%d", bi.biYPelsPerMeter);
    qDebug("biClrUsed........%d", bi.biClrUsed);
    qDebug("biClrImportant...%d", bi.biClrImportant);
#endif
    int w = bi.biWidth,         h = bi.biHeight,  nbits = bi.biBitCount;
    int t = bi.biSize,         comp = bi.biCompression;
    uint red_mask = 0;
    uint green_mask = 0;
    uint blue_mask = 0;
    uint alpha_mask = 0;
    uint red_shift = 0;
    uint green_shift = 0;
    uint blue_shift = 0;
    uint alpha_shift = 0;
    uint red_scale = 0;
    uint green_scale = 0;
    uint blue_scale = 0;
    uint alpha_scale = 0;
    bool bitfields = comp == BMP_BITFIELDS || comp == BMP_ALPHABITFIELDS;

    if (!d->isSequential())
        d->seek(startpos + bi.biSize); // goto start of colormap or masks

    if (bi.biSize >= BMP_WIN4) {
        red_mask = bi.biRedMask;
        green_mask = bi.biGreenMask;
        blue_mask = bi.biBlueMask;
        alpha_mask = bi.biAlphaMask;
    } else if (bitfields && (nbits == 16 || nbits == 32)) {
        if (d->read((char *)&red_mask, sizeof(red_mask)) != sizeof(red_mask))
            return false;
        if (d->read((char *)&green_mask, sizeof(green_mask)) != sizeof(green_mask))
            return false;
        if (d->read((char *)&blue_mask, sizeof(blue_mask)) != sizeof(blue_mask))
            return false;
        if (comp == BMP_ALPHABITFIELDS && d->read((char *)&alpha_mask, sizeof(alpha_mask)) != sizeof(alpha_mask))
            return false;
    }

    bool transp = bitfields || (comp == BMP_RGB && nbits == 32 && alpha_mask == 0xff000000);
    transp = transp && alpha_mask;

    int ncols = 0;
    int depth = 0;
    QImage::Format format;
    switch (nbits) {
        case 32:
        case 24:
        case 16:
            depth = 32;
            format = transp ? QImage::Format_ARGB32 : QImage::Format_RGB32;
            break;
        case 8:
        case 4:
            depth = 8;
            format = QImage::Format_Indexed8;
            break;
        case 1:
            depth = 1;
            format = QImage::Format_Mono;
            break;
        default:
            return false;
            break;
    }

    if (depth != 32) {
        ncols = bi.biClrUsed ? bi.biClrUsed : 1 << nbits;
        if (ncols < 1 || ncols > 256) // sanity check - don't run out of mem if color table is broken
            return false;
    }

    if (bi.biHeight < 0)
        h = -h;                  // support images with negative height

    if (!QImageIOHandler::allocateImage(QSize(w, h), format, &image))
        return false;
    if (ncols > 0) {                                // read color table
        image.setColorCount(ncols);
        uchar rgb[4];
        int   rgb_len = t == BMP_OLD ? 3 : 4;
        for (int i=0; i<ncols; i++) {
            if (d->read((char *)rgb, rgb_len) != rgb_len)
                return false;
            image.setColor(i, qRgb(rgb[2],rgb[1],rgb[0]));
            if (d->atEnd())                        // truncated file
                return false;
        }
    } else if (bitfields && (nbits == 16 || nbits == 32)) {
        red_shift = calc_shift(red_mask);
        if (((red_mask >> red_shift) + 1) == 0)
            return false;
        red_scale = calc_scale(red_mask >> red_shift);
        green_shift = calc_shift(green_mask);
        if (((green_mask >> green_shift) + 1) == 0)
            return false;
        green_scale = calc_scale(green_mask >> green_shift);
        blue_shift = calc_shift(blue_mask);
        if (((blue_mask >> blue_shift) + 1) == 0)
            return false;
        blue_scale = calc_scale(blue_mask >> blue_shift);
        alpha_shift = calc_shift(alpha_mask);
        if (((alpha_mask >> alpha_shift) + 1) == 0)
            return false;
        alpha_scale = calc_scale(alpha_mask >> alpha_shift);
    } else if (comp == BMP_RGB && (nbits == 24 || nbits == 32)) {
        blue_mask = 0x000000ff;
        green_mask = 0x0000ff00;
        red_mask = 0x00ff0000;
        blue_shift = 0;
        green_shift = 8;
        red_shift = 16;
        blue_scale = green_scale = red_scale = 0;
        if (transp) {
            alpha_shift = calc_shift(alpha_mask);
            if (((alpha_mask >> alpha_shift) + 1) == 0)
                return false;
            alpha_scale = calc_scale(alpha_mask >> alpha_shift);
        }
    } else if (comp == BMP_RGB && nbits == 16) {
        blue_mask = 0x001f;
        green_mask = 0x03e0;
        red_mask = 0x7c00;
        blue_shift = 0;
        green_shift = 5;
        red_shift = 10;
        blue_scale = green_scale = red_scale = 3;
    }

    image.setDotsPerMeterX(bi.biXPelsPerMeter);
    image.setDotsPerMeterY(bi.biYPelsPerMeter);

#if 0
    qDebug("Rmask: %08x Rshift: %08x Rscale:%08x", red_mask, red_shift, red_scale);
    qDebug("Gmask: %08x Gshift: %08x Gscale:%08x", green_mask, green_shift, green_scale);
    qDebug("Bmask: %08x Bshift: %08x Bscale:%08x", blue_mask, blue_shift, blue_scale);
    qDebug("Amask: %08x Ashift: %08x Ascale:%08x", alpha_mask, alpha_shift, alpha_scale);
#endif

    if (datapos >= 0 && datapos > d->pos()) {
        if (!d->isSequential())
            d->seek(datapos); // start of image data
    }

    int             bpl = image.bytesPerLine();
    uchar *data = image.bits();

    if (nbits == 1) {                                // 1 bit BMP image
        while (--h >= 0) {
            if (d->read((char*)(data + h*bpl), bpl) != bpl)
                break;
        }
        if (ncols == 2 && qGray(image.color(0)) < qGray(image.color(1)))
            swapPixel01(&image);                // pixel 0 is white!
    }

    else if (nbits == 4) {                        // 4 bit BMP image
        int    buflen = ((w+7)/8)*4;
        uchar *buf    = new uchar[buflen];
        if (comp == BMP_RLE4) {                // run length compression
            int x=0, y=0, c, i;
            quint8 b;
            uchar *p = data + (h-1)*bpl;
            const uchar *endp = p + w;
            while (y < h) {
                if (!d->getChar((char *)&b))
                    break;
                if (b == 0) {                        // escape code
                    if (!d->getChar((char *)&b) || b == 1) {
                        y = h;                // exit loop
                    } else switch (b) {
                        case 0:                        // end of line
                            x = 0;
                            y++;
                            p = data + (h-y-1)*bpl;
                            break;
                        case 2:                        // delta (jump)
                        {
                            quint8 tmp;
                            d->getChar((char *)&tmp);
                            x += tmp;
                            d->getChar((char *)&tmp);
                            y += tmp;
                        }

                            // Protection
                            if ((uint)x >= (uint)w)
                                x = w-1;
                            if ((uint)y >= (uint)h)
                                y = h-1;

                            p = data + (h-y-1)*bpl + x;
                            break;
                        default:                // absolute mode
                            // Protection
                            if (p + b > endp)
                                b = endp-p;

                            i = (c = b)/2;
                            while (i--) {
                                d->getChar((char *)&b);
                                *p++ = b >> 4;
                                *p++ = b & 0x0f;
                            }
                            if (c & 1) {
                                unsigned char tmp;
                                d->getChar((char *)&tmp);
                                *p++ = tmp >> 4;
                            }
                            if ((((c & 3) + 1) & 2) == 2)
                                d->getChar(nullptr);        // align on word boundary
                            x += c;
                    }
                } else {                        // encoded mode
                    // Protection
                    if (p + b > endp)
                        b = endp-p;

                    i = (c = b)/2;
                    d->getChar((char *)&b);                // 2 pixels to be repeated
                    while (i--) {
                        *p++ = b >> 4;
                        *p++ = b & 0x0f;
                    }
                    if (c & 1)
                        *p++ = b >> 4;
                    x += c;
                }
            }
        } else if (comp == BMP_RGB) {                // no compression
            memset(data, 0, h*bpl);
            while (--h >= 0) {
                if (d->read((char*)buf,buflen) != buflen)
                    break;
                uchar *p = data + h*bpl;
                uchar *b = buf;
                for (int i=0; i<w/2; i++) {        // convert nibbles to bytes
                    *p++ = *b >> 4;
                    *p++ = *b++ & 0x0f;
                }
                if (w & 1)                        // the last nibble
                    *p = *b >> 4;
            }
        }
        delete [] buf;
    }

    else if (nbits == 8) {                        // 8 bit BMP image
        if (comp == BMP_RLE8) {                // run length compression
            int x=0, y=0;
            quint8 b;
            uchar *p = data + (h-1)*bpl;
            const uchar *endp = p + w;
            while (y < h) {
                if (!d->getChar((char *)&b))
                    break;
                if (b == 0) {                        // escape code
                    if (!d->getChar((char *)&b) || b == 1) {
                            y = h;                // exit loop
                    } else switch (b) {
                        case 0:                        // end of line
                            x = 0;
                            y++;
                            p = data + (h-y-1)*bpl;
                            break;
                        case 2:                        // delta (jump)
                            {
                                quint8 tmp;
                                d->getChar((char *)&tmp);
                                x += tmp;
                                d->getChar((char *)&tmp);
                                y += tmp;
                            }

                            // Protection
                            if ((uint)x >= (uint)w)
                                x = w-1;
                            if ((uint)y >= (uint)h)
                                y = h-1;

                            p = data + (h-y-1)*bpl + x;
                            break;
                        default:                // absolute mode
                            // Protection
                            if (p + b > endp)
                                b = endp-p;

                            if (d->read((char *)p, b) != b)
                                return false;
                            if ((b & 1) == 1)
                                d->getChar(nullptr);        // align on word boundary
                            x += b;
                            p += b;
                    }
                } else {                        // encoded mode
                    // Protection
                    if (p + b > endp)
                        b = endp-p;

                    char tmp;
                    d->getChar(&tmp);
                    memset(p, tmp, b); // repeat pixel
                    x += b;
                    p += b;
                }
            }
        } else if (comp == BMP_RGB) {                // uncompressed
            while (--h >= 0) {
                if (d->read((char *)data + h*bpl, bpl) != bpl)
                    break;
            }
        }
    }

    else if (nbits == 16 || nbits == 24 || nbits == 32) { // 16,24,32 bit BMP image
        QRgb *p;
        QRgb  *end;
        uchar *buf24 = new uchar[bpl];
        int    bpl24 = ((w*nbits+31)/32)*4;
        uchar *b;
        int c;

        while (--h >= 0) {
            p = (QRgb *)(data + h*bpl);
            end = p + w;
            if (d->read((char *)buf24,bpl24) != bpl24)
                break;
            b = buf24;
            while (p < end) {
                c = *(uchar*)b | (*(uchar*)(b+1)<<8);
                if (nbits > 16)
                    c |= *(uchar*)(b+2)<<16;
                if (nbits > 24)
                    c |= *(uchar*)(b+3)<<24;
                *p++ = qRgba(apply_scale((c & red_mask) >> red_shift, red_scale),
                             apply_scale((c & green_mask) >> green_shift, green_scale),
                             apply_scale((c & blue_mask) >> blue_shift, blue_scale),
                             transp ? apply_scale((c & alpha_mask) >> alpha_shift, alpha_scale) : 0xff);
                b += nbits/8;
            }
        }
        delete[] buf24;
    }

    if (bi.biHeight < 0) {
        // Flip the image
        uchar *buf = new uchar[bpl];
        h = -bi.biHeight;
        for (int y = 0; y < h/2; ++y) {
            memcpy(buf, data + y*bpl, bpl);
            memcpy(data + y*bpl, data + (h-y-1)*bpl, bpl);
            memcpy(data + (h-y-1)*bpl, buf, bpl);
        }
        delete [] buf;
    }

    return true;
}